

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisjunctiveIntervalMap.h
# Opt level: O0

_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
 __thiscall
dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
_shift_le<std::_Rb_tree_const_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
          (DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *this,
          _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
          *startge,IntervalT *I)

{
  bool bVar1;
  pointer ppVar2;
  Offset *in_RDX;
  _Self *in_RSI;
  const_iterator last;
  _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
  tmp;
  DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *in_stack_ffffffffffffffa8;
  _Self *__x;
  _Self local_38;
  _Base_ptr local_30;
  _Self local_28;
  Offset *local_20;
  _Self *local_18;
  _Base_ptr local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_28._M_node =
       (_Base_ptr)
       DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::end(in_stack_ffffffffffffffa8);
  bVar1 = std::operator==(in_RSI,&local_28);
  if (bVar1) {
    local_30 = (_Base_ptr)
               DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::_get_last
                         (in_stack_ffffffffffffffa8);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                           *)0x179e6f);
    bVar1 = Offset::operator>=(&(ppVar2->first).end,local_20);
    if (bVar1) {
      local_8 = local_30;
    }
    else {
      local_8 = (_Base_ptr)
                DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::end
                          (in_stack_ffffffffffffffa8);
    }
  }
  else {
    __x = local_18;
    local_38._M_node =
         (_Base_ptr)
         DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::begin(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(__x,&local_38);
    if (bVar1) {
      local_8 = local_18->_M_node;
      std::
      _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
      ::operator--(__x);
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                             *)0x179ef8);
      bVar1 = Offset::operator>=(&(ppVar2->first).end,local_20);
      if (bVar1) {
        return (_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                )local_8;
      }
    }
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                           *)0x179f1d);
    bVar1 = Offset::operator>((Offset *)ppVar2,local_20 + 1);
    if (bVar1) {
      local_8 = (_Base_ptr)
                DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::end
                          (in_stack_ffffffffffffffa8);
    }
    else {
      local_8 = local_18->_M_node;
    }
  }
  return (_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
          )local_8;
}

Assistant:

IteratorT _shift_le(const IteratorT &startge, const IntervalT &I) const {
        // find the element that starts at the same value
        // as I or later (i.e. I.start >= it.start)
        if (startge == end()) {
            auto last = _get_last();
            if (last->first.end >= I.start) {
                assert(last->first.overlaps(I));
                return last;
            }

            return end();
        }

        assert(startge->first.start >= I.start);

        // check whether there's
        // an previous interval with an overlap
        if (startge != begin()) {
            auto tmp = startge;
            --tmp;
            if (tmp->first.end >= I.start) {
                assert(tmp->first.overlaps(I));
                return tmp;
            }
            // fall-through
        }

        // starge is the first interval or the
        // previous interval does not overlap.
        // Just check whether this interval overlaps
        if (startge->first.start > I.end)
            return end();

        assert(startge->first.overlaps(I));
        return startge;
    }